

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O2

void test_region_rgn(Am_Region *rgn1,Am_Region *rgn2,bool val1,bool val2)

{
  char cVar1;
  bool total;
  char error [200];
  char local_e9;
  char local_e8 [200];
  
  cVar1 = (**(code **)(*(long *)rgn1 + 0x20))(rgn1,rgn2,&local_e9);
  if (((bool)cVar1 == val1) && ((bool)local_e9 == val2)) {
    return;
  }
  sprintf(local_e8,"** test_region_rgn failed with rgn1 = %p, rgn2 = %p.\n",rgn1,rgn2);
  Am_Error(local_e8);
}

Assistant:

void
test_region_rgn(Am_Region *rgn1, Am_Region *rgn2, bool val1, bool val2)
{
  bool total;
  if ((!(rgn1->In(rgn2, total) == val1)) || (!(total == val2))) {
    char error[200];
    sprintf(error, "** test_region_rgn failed with rgn1 = %p, rgn2 = %p.\n",
            rgn1, rgn2);
    Am_Error(error);
  }
}